

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_b::_Run(_Test_L0_CompactionBug_Issue44_b *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Env *pEVar3;
  string local_250;
  pointer local_230;
  char *pcStack_228;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  Tester local_1c0;
  
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  pcVar2 = (pointer)((long)&local_1c0 + 0x10);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  paVar1 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1c8);
  if (local_1c8 != (void *)0x0) {
    operator_delete__(local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"e","");
  local_230 = (pointer)((ulong)local_230 & 0xffffffffffffff00);
  local_250._M_dataplus._M_p = (pointer)local_1c0._0_8_;
  local_250._M_string_length._0_4_ = local_1c0.fname_._0_4_;
  local_250._M_string_length._4_4_ = local_1c0.fname_._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_1d0);
  if (local_1d0 != (void *)0x0) {
    operator_delete__(local_1d0);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1d8);
  if (local_1d8 != (void *)0x0) {
    operator_delete__(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"c","");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"cv","");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1e0);
  if (local_1e0 != (void *)0x0) {
    operator_delete__(local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1e8);
  if (local_1e8 != (void *)0x0) {
    operator_delete__(local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1f0);
  if (local_1f0 != (void *)0x0) {
    operator_delete__(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  pEVar3 = Env::Default();
  (*pEVar3->_vptr_Env[0x14])(pEVar3);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"d","");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"dv","");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1f8);
  if (local_1f8 != (void *)0x0) {
    operator_delete__(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  local_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  local_230 = (pointer)local_1c0._0_8_;
  pcStack_228 = local_1c0.fname_;
  local_220 = local_250._M_dataplus._M_p._0_4_;
  uStack_21c = local_250._M_dataplus._M_p._4_4_;
  uStack_218 = (undefined4)local_250._M_string_length;
  uStack_214 = local_250._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_200);
  if (local_200 != (void *)0x0) {
    operator_delete__(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"d","");
  local_230 = (pointer)((ulong)local_230 & 0xffffffffffffff00);
  local_250._M_dataplus._M_p = (pointer)local_1c0._0_8_;
  local_250._M_string_length._0_4_ = local_1c0.fname_._0_4_;
  local_250._M_string_length._4_4_ = local_1c0.fname_._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_208);
  if (local_208 != (void *)0x0) {
    operator_delete__(local_208);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"b","");
  local_230 = (pointer)((ulong)local_230 & 0xffffffffffffff00);
  local_250._M_dataplus._M_p = (pointer)local_1c0._0_8_;
  local_250._M_string_length._0_4_ = local_1c0.fname_._0_4_;
  local_250._M_string_length._4_4_ = local_1c0.fname_._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_210);
  if (local_210 != (void *)0x0) {
    operator_delete__(local_210);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_);
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c0.line_ = 0x5d2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  DBTest::Contents_abi_cxx11_(&local_250,&this->super_DBTest);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            (&local_1c0,(char (*) [12])"(->)(c->cv)",&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c0);
  pEVar3 = Env::Default();
  (*pEVar3->_vptr_Env[0x14])(pEVar3,1000000);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c0.line_ = 0x5d4;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  DBTest::Contents_abi_cxx11_(&local_250,&this->super_DBTest);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            (&local_1c0,(char (*) [12])"(->)(c->cv)",&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c0);
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_b) {
  Reopen();
  Put("", "");
  Reopen();
  Delete("e");
  Put("", "");
  Reopen();
  Put("c", "cv");
  Reopen();
  Put("", "");
  Reopen();
  Put("", "");
  DelayMilliseconds(1000);  // Wait for compaction to finish
  Reopen();
  Put("d", "dv");
  Reopen();
  Put("", "");
  Reopen();
  Delete("d");
  Delete("b");
  Reopen();
  ASSERT_EQ("(->)(c->cv)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(->)(c->cv)", Contents());
}